

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

uint8_t rev_byte(uint8_t sprite_byte)

{
  byte bVar1;
  uint uVar2;
  uint8_t bit_num;
  int iVar3;
  long lVar4;
  char *pcVar5;
  undefined3 in_register_00000039;
  char acStack_8 [8];
  
  uVar2 = 1;
  lVar4 = 0;
  do {
    acStack_8[lVar4] = (uVar2 & CONCAT31(in_register_00000039,sprite_byte)) != 0;
    uVar2 = (uVar2 & 0xff) * 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  iVar3 = 0;
  pcVar5 = acStack_8 + 7;
  bVar1 = 0;
  do {
    bVar1 = bVar1 | *pcVar5 << ((byte)iVar3 & 0x1f);
    iVar3 = iVar3 + 1;
    pcVar5 = pcVar5 + -1;
  } while (iVar3 != 8);
  return bVar1;
}

Assistant:

static uint8_t rev_byte(uint8_t sprite_byte) {
    uint8_t bit_count = 8;
    bool bits[bit_count];
    uint8_t reversed = 0;

    uint8_t mask = 0x1;
    for(uint8_t bit_num = 0; bit_num < bit_count; bit_num++) {
        bits[bit_num] = sprite_byte & mask;
        mask <<= 1;
    }

    uint8_t shift_amount = 0;
    for(int bits_left = 7; bits_left >= 0; bits_left--) {
        reversed |= bits[bits_left] << shift_amount;
        shift_amount++;
    }
    return reversed;
}